

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZTensor.h
# Opt level: O3

TPZFMatrix<TFad<6,_double>_> * __thiscall
TPZTensor::operator_cast_to_TPZFMatrix
          (TPZFMatrix<TFad<6,_double>_> *__return_storage_ptr__,TPZTensor *this)

{
  undefined8 *puVar1;
  int i;
  undefined8 *puVar2;
  long lVar3;
  int i_7;
  TFad<6,_double> *pTVar4;
  int i_1;
  long lVar5;
  long lVar6;
  TFad<6,_double> *pTVar7;
  
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow = 3;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol = 3;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fDecomposed = '\0'
  ;
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fDefPositive =
       '\0';
  (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.super_TPZSavable.
  _vptr_TPZSavable = (_func_int **)&PTR__TPZFMatrix_018320d8;
  __return_storage_ptr__->fElem = (TFad<6,_double> *)0x0;
  __return_storage_ptr__->fGiven = (TFad<6,_double> *)0x0;
  __return_storage_ptr__->fSize = 0;
  TPZVec<int>::TPZVec(&(__return_storage_ptr__->fPivot).super_TPZVec<int>,0);
  (__return_storage_ptr__->fPivot).super_TPZVec<int>._vptr_TPZVec =
       (_func_int **)&PTR__TPZManVector_01815498;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fStore =
       (__return_storage_ptr__->fPivot).fExtAlloc;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNElements = 0;
  (__return_storage_ptr__->fPivot).super_TPZVec<int>.fNAlloc = 0;
  (__return_storage_ptr__->fWork)._vptr_TPZVec = (_func_int **)&PTR__TPZVec_0183b1b8;
  (__return_storage_ptr__->fWork).fStore = (TFad<6,_double> *)0x0;
  (__return_storage_ptr__->fWork).fNElements = 0;
  (__return_storage_ptr__->fWork).fNAlloc = 0;
  puVar2 = (undefined8 *)operator_new__(0x248);
  *puVar2 = 9;
  lVar3 = 0x10;
  do {
    *(undefined ***)((long)puVar2 + lVar3 + -8) = &PTR__TFad_01835938;
    *(undefined8 *)((long)puVar2 + lVar3) = 0;
    ((undefined8 *)((long)puVar2 + lVar3))[1] = 0;
    puVar1 = (undefined8 *)((long)puVar2 + lVar3 + 0x10);
    *puVar1 = 0;
    puVar1[1] = 0;
    puVar1 = (undefined8 *)((long)puVar2 + lVar3 + 0x20);
    *puVar1 = 0;
    puVar1[1] = 0;
    *(undefined8 *)((long)puVar2 + lVar3 + 0x30) = 0;
    lVar3 = lVar3 + 0x40;
  } while (lVar3 != 0x250);
  pTVar7 = (TFad<6,_double> *)(puVar2 + 1);
  __return_storage_ptr__->fElem = pTVar7;
  pTVar4 = *(TFad<6,_double> **)(this + 0x10);
  if (((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow < 1) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (pTVar7 != pTVar4) {
    lVar3 = 2;
    do {
      pTVar7->dx_[lVar3 + -2] = pTVar4->dx_[lVar3 + -2];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 8);
    puVar2[2] = pTVar4->val_;
  }
  pTVar4 = *(TFad<6,_double> **)(this + 0x10);
  if (((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow < 2) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (pTVar7 != pTVar4) {
    lVar3 = 0;
    do {
      puVar2[lVar3 + 0xb] = pTVar4[1].dx_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    puVar2[10] = pTVar4[1].val_;
  }
  lVar3 = (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  if ((lVar3 < 1) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 2)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  pTVar4 = pTVar7 + lVar3;
  if (pTVar4 != (TFad<6,_double> *)(puVar2 + 9)) {
    lVar5 = 0;
    do {
      pTVar4->dx_[lVar5] = (double)puVar2[lVar5 + 0xb];
      lVar5 = lVar5 + 1;
    } while (lVar5 != 6);
    pTVar4->val_ = (double)puVar2[10];
  }
  pTVar4 = *(TFad<6,_double> **)(this + 0x10);
  if ((lVar3 < 3) ||
     ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 1)) {
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  if (pTVar7 != pTVar4) {
    lVar3 = 0;
    do {
      puVar2[lVar3 + 0x13] = pTVar4[2].dx_[lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar3 != 6);
    puVar2[0x12] = pTVar4[2].val_;
  }
  lVar3 = (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fRow;
  if ((0 < lVar3) &&
     (2 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol)) {
    pTVar4 = pTVar7 + lVar3 * 2;
    if (pTVar4 != (TFad<6,_double> *)(puVar2 + 0x11)) {
      lVar5 = 0;
      do {
        pTVar4->dx_[lVar5] = (double)puVar2[lVar5 + 0x13];
        lVar5 = lVar5 + 1;
      } while (lVar5 != 6);
      pTVar4->val_ = (double)puVar2[0x12];
    }
    lVar5 = *(long *)(this + 0x10);
    if ((lVar3 < 2) ||
       ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 2)) {
      TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    if (pTVar7 + lVar3 + 1 != (TFad<6,_double> *)(lVar5 + 0xc0)) {
      lVar6 = 0;
      do {
        pTVar7[lVar3 + 1].dx_[lVar6] = *(double *)(lVar5 + 0xd0 + lVar6 * 8);
        lVar6 = lVar6 + 1;
      } while (lVar6 != 6);
      pTVar7[lVar3 + 1].val_ = *(double *)(lVar5 + 200);
    }
    lVar5 = *(long *)(this + 0x10);
    if ((2 < lVar3) &&
       (1 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol)) {
      if (pTVar7 + lVar3 + 2 != (TFad<6,_double> *)(lVar5 + 0x100)) {
        lVar6 = 0;
        do {
          pTVar7[lVar3 + 2].dx_[lVar6] = *(double *)(lVar5 + 0x110 + lVar6 * 8);
          lVar6 = lVar6 + 1;
        } while (lVar6 != 6);
        pTVar7[lVar3 + 2].val_ = *(double *)(lVar5 + 0x108);
      }
      if ((lVar3 < 2) ||
         ((__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol < 3))
      {
        TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
        pzinternal::DebugStopImpl
                  ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                   ,0x26d);
      }
      if (pTVar7 + lVar3 * 2 + 1 != pTVar7 + lVar3 + 2) {
        lVar5 = 0;
        do {
          pTVar7[lVar3 * 2 + 1].dx_[lVar5] = pTVar7[lVar3 + 2].dx_[lVar5];
          lVar5 = lVar5 + 1;
        } while (lVar5 != 6);
        pTVar7[lVar3 * 2 + 1].val_ = pTVar7[lVar3 + 2].val_;
      }
      lVar5 = *(long *)(this + 0x10);
      if ((2 < lVar3) &&
         (2 < (__return_storage_ptr__->super_TPZMatrix<TFad<6,_double>_>).super_TPZBaseMatrix.fCol))
      {
        if (pTVar7 + lVar3 * 2 + 2 != (TFad<6,_double> *)(lVar5 + 0x140)) {
          lVar6 = 0;
          do {
            pTVar7[lVar3 * 2 + 2].dx_[lVar6] = *(double *)(lVar5 + 0x150 + lVar6 * 8);
            lVar6 = lVar6 + 1;
          } while (lVar6 != 6);
          pTVar7[lVar3 * 2 + 2].val_ = *(double *)(lVar5 + 0x148);
        }
        return __return_storage_ptr__;
      }
      TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
      pzinternal::DebugStopImpl
                ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
                 ,0x26d);
    }
    TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
    pzinternal::DebugStopImpl
              ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h"
               ,0x26d);
  }
  TPZFMatrix<TFad<6,_double>_>::Error("TPZFMatrix<TVar>::operator() "," Index out of bounds");
  pzinternal::DebugStopImpl
            ("/workspace/llm4binary/github/license_c_cmakelists/labmec[P]neopz/Matrix/pzfmatrix.h",
             0x26d);
}

Assistant:

operator TPZFMatrix<T>() const {
        TPZFMatrix<T> result(3, 3);
        result(0, 0) = XX();
        result(0, 1) = result(1, 0) = XY();
        result(0, 2) = result(2, 0) = XZ();
        result(1, 1) = YY();
        result(1, 2) = result(2, 1) = YZ();
        result(2, 2) = ZZ();
        return result;
    }